

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

void x9_62_free_context(st_x9_62_keyex_context_t *ctx)

{
  void *in_RDI;
  
  free(*(void **)((long)in_RDI + 8));
  if (*(long *)((long)in_RDI + 0x28) != 0) {
    EC_KEY_free(*(EC_KEY **)((long)in_RDI + 0x28));
  }
  if (*(long *)((long)in_RDI + 0x20) != 0) {
    BN_CTX_free(*(BN_CTX **)((long)in_RDI + 0x20));
  }
  free(in_RDI);
  return;
}

Assistant:

static void x9_62_free_context(struct st_x9_62_keyex_context_t *ctx)
{
    free(ctx->super.pubkey.base);
    if (ctx->privkey != NULL)
        EC_KEY_free(ctx->privkey);
    if (ctx->bn_ctx != NULL)
        BN_CTX_free(ctx->bn_ctx);
    free(ctx);
}